

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> * __thiscall
helics::FederateState::getSubscribers(FederateState *this,InterfaceHandle handle)

{
  bool bVar1;
  PublicationInfo *this_00;
  GlobalHandle *in_RSI;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *in_RDI;
  SubscriberInformation *sub;
  iterator __end2;
  iterator __begin2;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *__range2;
  PublicationInfo *pubInfo;
  lock_guard<helics::FederateState> fedlock;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *subs;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__lhs;
  __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  InterfaceHandle handle_00;
  
  handle_00.hid = (BaseType)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  __lhs = in_RDI;
  std::lock_guard<helics::FederateState>::lock_guard
            ((lock_guard<helics::FederateState> *)in_RDI,(mutex_type *)in_RDI);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x58ec07);
  this_00 = InterfaceInfo::getPublication
                      ((InterfaceInfo *)in_stack_ffffffffffffffa8._M_current,handle_00);
  if (this_00 != (PublicationInfo *)0x0) {
    std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
    begin((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *)
          in_RDI);
    std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::end
              ((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                             ((__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                               *)__lhs,(__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                                        *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
      ::operator*((__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                   *)&stack0xffffffffffffffa8);
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      emplace_back<helics::GlobalHandle_const&>
                ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)this_00,
                 in_RSI);
      __gnu_cxx::
      __normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
      ::operator++((__normal_iterator<helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                    *)&stack0xffffffffffffffa8);
    }
  }
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x58ecf5)
  ;
  return in_RDI;
}

Assistant:

std::vector<GlobalHandle> FederateState::getSubscribers(InterfaceHandle handle)
{
    const std::lock_guard<FederateState> fedlock(*this);
    std::vector<GlobalHandle> subs;
    auto* pubInfo = interfaceInformation.getPublication(handle);
    if (pubInfo != nullptr) {
        for (const auto& sub : pubInfo->subscribers) {
            subs.emplace_back(sub.id);
        }
    }
    return subs;
}